

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validateGetShapeLayer
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  bool bVar1;
  Result *pRVar2;
  Result local_a8;
  undefined1 local_70 [48];
  Result_conflict r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r._32_8_ = layer;
  Result::Result((Result *)(local_70 + 0x28));
  validateInputCount((Result_conflict *)local_70,(NeuralNetworkLayer *)r._32_8_,1,1);
  pRVar2 = Result::operator=((Result *)(local_70 + 0x28),(Result *)local_70);
  bVar1 = Result::good(pRVar2);
  Result::~Result((Result *)local_70);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    validateOutputCount((Result_conflict *)&local_a8,(NeuralNetworkLayer *)r._32_8_,1,1);
    pRVar2 = Result::operator=((Result *)(local_70 + 0x28),&local_a8);
    bVar1 = Result::good(pRVar2);
    Result::~Result(&local_a8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      Result::Result((Result *)__return_storage_ptr__);
    }
    else {
      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
    }
  }
  else {
    Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
  }
  local_a8.m_message._M_storage._M_storage[0] = '\x01';
  local_a8.m_message._M_storage._M_storage[1] = '\0';
  local_a8.m_message._M_storage._M_storage[2] = '\0';
  local_a8.m_message._M_storage._M_storage[3] = '\0';
  Result::~Result((Result *)(local_70 + 0x28));
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateGetShapeLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (!(r = validateInputCount(layer, 1, 1)).good()) return r;
    if (!(r = validateOutputCount(layer, 1, 1)).good()) return r;
    return Result();
}